

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char,char,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,char *params_1,char *params_2)

{
  FixedArray<char,_1UL> local_b;
  FixedArray<char,_1UL> local_a;
  kj local_9;
  
  local_9 = *this;
  local_a.content[0] = (char  [1])*params;
  local_b.content[0] = (char  [1])*params_1;
  StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&local_9,&local_a,&local_b,
             (FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}